

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t14(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  uVar3 = al_ustr_new(anon_var_dwarf_3c4);
  cVar1 = al_ustr_truncate(uVar3,0x1e);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_truncate(us1, 30)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_truncate(us1, 30)");
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4f6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_50d);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_50d);
    error = error + 1;
  }
  cVar1 = al_ustr_truncate(uVar3,100);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_truncate(us1, 100)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_truncate(us1, 100)");
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4f6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_50d);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_50d);
    error = error + 1;
  }
  cVar1 = al_ustr_truncate(uVar3,0xffffffff);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_truncate(us1, -1)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_truncate(us1, -1)");
    error = error + 1;
  }
  pcVar4 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar4,anon_var_dwarf_4f6);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_50d);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_50d);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t14(void)
{
   ALLEGRO_USTR *us1 = al_ustr_new("aábdðeéfghiíjkprstuúvxyýþæö");

   /* Truncate from middle of string. */
   CHECK(al_ustr_truncate(us1, 30));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   /* Truncate past end (allowed). */
   CHECK(al_ustr_truncate(us1, 100));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   /* Truncate before start (not allowed). */
   CHECK(! al_ustr_truncate(us1, -1));
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjkprstuúvxyý"));

   al_ustr_free(us1);
}